

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::FormValue>::mapping(IO *IO,FormValue *FormValue)

{
  int iVar1;
  
  yaml::IO::mapOptional<llvm::yaml::Hex64>(IO,"Value",&FormValue->Value);
  if ((FormValue->CStr).Length == 0) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 != '\0') goto LAB_00b57969;
  }
  yaml::IO::mapOptional<llvm::StringRef>(IO,"CStr",&FormValue->CStr);
LAB_00b57969:
  if ((FormValue->BlockData).super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (FormValue->BlockData).super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 != '\0') {
      return;
    }
  }
  yaml::IO::mapOptional<std::vector<llvm::yaml::Hex8,std::allocator<llvm::yaml::Hex8>>>
            (IO,"BlockData",&FormValue->BlockData);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::FormValue>::mapping(
    IO &IO, DWARFYAML::FormValue &FormValue) {
  IO.mapOptional("Value", FormValue.Value);
  if (!FormValue.CStr.empty() || !IO.outputting())
    IO.mapOptional("CStr", FormValue.CStr);
  if (!FormValue.BlockData.empty() || !IO.outputting())
    IO.mapOptional("BlockData", FormValue.BlockData);
}